

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O1

void rxa2_fill_segment(argon2_instance_t *instance,argon2_position_t position)

{
  block *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  uint uVar5;
  int with_xor;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  block zero_block;
  block address_block;
  argon2_position_t local_c50;
  ulong local_c40;
  undefined1 local_c38 [16];
  ulong local_c28;
  ulong local_c20;
  ulong local_c18;
  ulong local_c10;
  uint64_t local_c08;
  block local_830;
  block local_430;
  
  if (instance != (argon2_instance_t *)0x0) {
    bVar11 = true;
    if (((instance->type != Argon2_i) && (bVar11 = false, instance->type == Argon2_id)) &&
       (local_c50.pass = position.pass, local_c50.pass == 0)) {
      local_c50.slice = position.slice;
      bVar11 = local_c50.slice < 2;
    }
    local_c50._0_8_ = position._0_8_;
    local_c50._8_8_ = position._8_8_;
    if (bVar11) {
      rxa2_init_block_value(&local_830,'\0');
      rxa2_init_block_value((block *)local_c38,'\0');
      local_c38._8_4_ = local_c50.lane;
      local_c38._0_8_ = local_c50._0_8_ & 0xffffffff;
      local_c38._12_4_ = 0;
      local_c28 = local_c50._8_8_ & 0xff;
      local_c20 = (ulong)instance->memory_blocks;
      local_c18 = (ulong)instance->passes;
      local_c10 = (ulong)instance->type;
    }
    bVar2 = local_c50.slice == '\0' && local_c50.pass == 0;
    if ((bool)(bVar11 & bVar2)) {
      local_c08 = local_c08 + 1;
      fill_block(&local_830,(block *)local_c38,&local_430,0);
      fill_block(&local_830,&local_430,&local_430,0);
      uVar10 = 2;
    }
    else {
      uVar10 = (uint)bVar2 * 2;
    }
    if (uVar10 < instance->segment_length) {
      uVar9 = instance->lane_length;
      uVar5 = (uint)local_c50.slice * instance->segment_length + local_c50.lane * uVar9;
      local_c40 = (ulong)uVar5;
      uVar5 = uVar5 + uVar10;
      uVar5 = (-(uint)(uVar5 % uVar9 != 0) | uVar9 - 1) + uVar5;
      do {
        uVar7 = (int)local_c40 + uVar10;
        uVar9 = (int)local_c40 + -1 + uVar10;
        if (uVar7 % instance->lane_length != 1) {
          uVar9 = uVar5;
        }
        if (bVar11) {
          if ((uVar10 & 0x7f) == 0) {
            local_c08 = local_c08 + 1;
            fill_block(&local_830,(block *)local_c38,&local_430,0);
            fill_block(&local_830,&local_430,&local_430,0);
          }
          puVar4 = local_430.v + (uVar10 & 0x7f);
        }
        else {
          puVar4 = instance->memory[uVar9].v;
        }
        uVar6 = (*puVar4 >> 0x20) % (ulong)instance->lanes;
        uVar8 = uVar6;
        if (local_c50.slice == '\0') {
          uVar8 = (ulong)local_c50._0_8_ >> 0x20;
        }
        if (local_c50.pass != 0) {
          uVar8 = uVar6;
        }
        local_c50.index = uVar10;
        uVar3 = rxa2_index_alpha(instance,&local_c50,(uint32_t)*puVar4,
                                 (uint)(uVar8 == (ulong)local_c50._0_8_ >> 0x20));
        pbVar1 = instance->memory;
        if ((instance->version == 0x10) || (local_c50.pass == 0)) {
          with_xor = 0;
        }
        else {
          with_xor = 1;
        }
        fill_block(pbVar1 + uVar9,pbVar1 + instance->lane_length * uVar8 + (ulong)uVar3,
                   pbVar1 + uVar7,with_xor);
        uVar10 = uVar10 + 1;
        uVar5 = uVar9 + 1;
      } while (uVar10 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void rxa2_fill_segment(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;
	int data_independent_addressing;

	if (instance == NULL) {
		return;
	}

	data_independent_addressing =
		(instance->type == Argon2_i) ||
		(instance->type == Argon2_id && (position.pass == 0) &&
		(position.slice < ARGON2_SYNC_POINTS / 2));

	if (data_independent_addressing) {
		rxa2_init_block_value(&zero_block, 0);
		rxa2_init_block_value(&input_block, 0);

		input_block.v[0] = position.pass;
		input_block.v[1] = position.lane;
		input_block.v[2] = position.slice;
		input_block.v[3] = instance->memory_blocks;
		input_block.v[4] = instance->passes;
		input_block.v[5] = instance->type;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */

		/* Don't forget to generate the first block of addresses: */
		if (data_independent_addressing) {
			next_addresses(&address_block, &input_block, &zero_block);
		}
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		if (data_independent_addressing) {
			if (i % ARGON2_ADDRESSES_IN_BLOCK == 0) {
				next_addresses(&address_block, &input_block, &zero_block);
			}
			pseudo_rand = address_block.v[i % ARGON2_ADDRESSES_IN_BLOCK];
		}
		else {
			pseudo_rand = instance->memory[prev_offset].v[0];
		}

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = rxa2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}